

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_MinorCompactionsHappen::_Run(_Test_MinorCompactionsHappen *this)

{
  ulong *puVar1;
  size_type *psVar2;
  DB *pDVar3;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  int i_00;
  int i_01;
  int i_02;
  int i_03;
  int level;
  int iVar7;
  undefined8 uVar8;
  int i;
  leveldb *plVar9;
  int result;
  uint uVar10;
  int result_1;
  int starting_num_tables;
  int ending_num_tables;
  Options options;
  undefined1 local_2f1;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  int local_26c;
  string local_268;
  Status local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  size_type local_238;
  Tester local_230;
  Options local_90;
  
  DBTest::CurrentOptions(&local_90,&this->super_DBTest);
  local_90.write_buffer_size = 10000;
  DBTest::Reopen(&this->super_DBTest,&local_90);
  iVar7 = 0;
  local_26c = 0;
  do {
    iVar4 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,iVar7);
    local_26c = local_26c + iVar4;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 7);
  uVar10 = 0;
  do {
    local_230.ok_ = true;
    local_230.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_230.line_ = 0x40c;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
    Key_abi_cxx11_(&local_2f0,(leveldb *)(ulong)uVar10,i_00);
    Key_abi_cxx11_(&local_2b0,(leveldb *)(ulong)uVar10,i_01);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_290,-0x18);
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      uVar8 = local_2b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_290._M_string_length + local_2b0._M_string_length) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar8 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_290._M_string_length + local_2b0._M_string_length) goto LAB_00111a55;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_290,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
    }
    else {
LAB_00111a55:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    puVar1 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar1) {
      local_2d0.field_2._M_allocated_capacity = *puVar1;
      local_2d0.field_2._8_8_ = puVar6[3];
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *puVar1;
      local_2d0._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_2d0._M_string_length = puVar6[1];
    *puVar6 = puVar1;
    puVar6[1] = 0;
    *(undefined1 *)puVar1 = 0;
    pDVar3 = (this->super_DBTest).db_;
    local_2f1 = 0;
    local_268._M_dataplus._M_p._0_4_ = local_2f0._M_dataplus._M_p._0_4_;
    local_268._M_dataplus._M_p._4_4_ = local_2f0._M_dataplus._M_p._4_4_;
    local_268._M_string_length._0_4_ = (undefined4)local_2f0._M_string_length;
    local_268._M_string_length._4_4_ = local_2f0._M_string_length._4_4_;
    local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p;
    local_238 = local_2d0._M_string_length;
    (*pDVar3->_vptr_DB[2])(&local_248,pDVar3,&local_2f1,&local_268,&local_240);
    test::Tester::IsOk(&local_230,&local_248);
    if (local_248.state_ != (char *)0x0) {
      operator_delete__(local_248.state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    test::Tester::~Tester(&local_230);
    uVar10 = uVar10 + 1;
  } while (uVar10 != 500);
  iVar7 = 0;
  iVar4 = 0;
  do {
    iVar5 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,iVar7);
    iVar4 = iVar4 + iVar5;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 7);
  local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_240._4_4_,iVar4);
  local_230.ok_ = true;
  local_230.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_230.line_ = 0x40f;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
  test::Tester::IsGt<int,int>(&local_230,(int *)&local_240,&local_26c);
  test::Tester::~Tester(&local_230);
  plVar9 = (leveldb *)0x0;
  do {
    local_230.ok_ = true;
    local_230.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_230.line_ = 0x412;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
    Key_abi_cxx11_(&local_2d0,plVar9,i_02);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_2b0,-0x18);
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      uVar8 = local_2d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_2b0._M_string_length + local_2d0._M_string_length) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar8 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_2b0._M_string_length + local_2d0._M_string_length) goto LAB_00111cae;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_2b0,0,(char *)0x0,(ulong)local_2d0._M_dataplus._M_p);
    }
    else {
LAB_00111cae:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    psVar2 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2) {
      local_2f0.field_2._M_allocated_capacity = *psVar2;
      local_2f0.field_2._8_8_ = puVar6[3];
    }
    else {
      local_2f0.field_2._M_allocated_capacity = *psVar2;
      local_2f0._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_2f0._M_string_length = puVar6[1];
    *puVar6 = psVar2;
    puVar6[1] = 0;
    *(undefined1 *)psVar2 = 0;
    Key_abi_cxx11_(&local_268,plVar9,(int)(puVar6 + 1));
    DBTest::Get(&local_290,&this->super_DBTest,&local_268,(Snapshot *)0x0);
    test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&local_230,&local_2f0,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_268._M_dataplus._M_p._4_4_,local_268._M_dataplus._M_p._0_4_) !=
        &local_268.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_268._M_dataplus._M_p._4_4_,local_268._M_dataplus._M_p._0_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    test::Tester::~Tester(&local_230);
    uVar10 = (int)plVar9 + 1;
    plVar9 = (leveldb *)(ulong)uVar10;
  } while (uVar10 != 500);
  plVar9 = (leveldb *)0x0;
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  do {
    local_230.ok_ = true;
    local_230.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_230.line_ = 0x418;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
    Key_abi_cxx11_(&local_2d0,plVar9,i_03);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_2b0,-0x18);
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      uVar8 = local_2d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_2b0._M_string_length + local_2d0._M_string_length) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar8 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_2b0._M_string_length + local_2d0._M_string_length) goto LAB_00111e84;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_2b0,0,(char *)0x0,(ulong)local_2d0._M_dataplus._M_p);
    }
    else {
LAB_00111e84:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    psVar2 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2) {
      local_2f0.field_2._M_allocated_capacity = *psVar2;
      local_2f0.field_2._8_8_ = puVar6[3];
    }
    else {
      local_2f0.field_2._M_allocated_capacity = *psVar2;
      local_2f0._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_2f0._M_string_length = puVar6[1];
    *puVar6 = psVar2;
    puVar6[1] = 0;
    *(undefined1 *)psVar2 = 0;
    Key_abi_cxx11_(&local_268,plVar9,(int)(puVar6 + 1));
    DBTest::Get(&local_290,&this->super_DBTest,&local_268,(Snapshot *)0x0);
    test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&local_230,&local_2f0,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_268._M_dataplus._M_p._4_4_,local_268._M_dataplus._M_p._0_4_) !=
        &local_268.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_268._M_dataplus._M_p._4_4_,local_268._M_dataplus._M_p._0_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    test::Tester::~Tester(&local_230);
    uVar10 = (int)plVar9 + 1;
    plVar9 = (leveldb *)(ulong)uVar10;
    if (uVar10 == 500) {
      return;
    }
  } while( true );
}

Assistant:

TEST(DBTest, MinorCompactionsHappen) {
  Options options = CurrentOptions();
  options.write_buffer_size = 10000;
  Reopen(&options);

  const int N = 500;

  int starting_num_tables = TotalTableFiles();
  for (int i = 0; i < N; i++) {
    ASSERT_OK(Put(Key(i), Key(i) + std::string(1000, 'v')));
  }
  int ending_num_tables = TotalTableFiles();
  ASSERT_GT(ending_num_tables, starting_num_tables);

  for (int i = 0; i < N; i++) {
    ASSERT_EQ(Key(i) + std::string(1000, 'v'), Get(Key(i)));
  }

  Reopen();

  for (int i = 0; i < N; i++) {
    ASSERT_EQ(Key(i) + std::string(1000, 'v'), Get(Key(i)));
  }
}